

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O3

void __thiscall HighsPrimalHeuristics::feasibilityPump(HighsPrimalHeuristics *this)

{
  HighsRandom *this_00;
  pointer *ppuVar1;
  double dVar2;
  double dVar3;
  int *piVar4;
  uint uVar5;
  double dVar6;
  pointer pdVar7;
  int64_t iVar8;
  bool bVar9;
  uint32_t uVar10;
  undefined8 uVar11;
  ulong uVar12;
  int *piVar13;
  uint64_t uVar14;
  long lVar15;
  long lVar16;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var17;
  long lVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double dVar22;
  pair<std::__detail::_Node_iterator<std::vector<int,_std::allocator<int>_>,_true,_true>,_bool>
  pVar23;
  vector<int,_std::allocator<int>_> referencepoint;
  vector<double,_std::allocator<double>_> roundedsol;
  vector<double,_std::allocator<double>_> cost;
  vector<int,_std::allocator<int>_> mask;
  unordered_set<std::vector<int,_std::allocator<int>_>,_HighsVectorHasher,_HighsVectorEqual,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  referencepoints;
  HighsDomain localdom;
  HighsLpRelaxation lprelax;
  Status local_57ec;
  vector<int,_std::allocator<int>_> local_57d8;
  double local_57b8;
  int local_57ac;
  vector<double,_std::allocator<double>_> local_57a8;
  vector<double,_std::allocator<double>_> local_5788;
  vector<int,_std::allocator<int>_> local_5770;
  _Hashtable<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>,_std::__detail::_Identity,_HighsVectorEqual,_HighsVectorHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_5758;
  HighsDomain local_5720;
  HighsLpRelaxation local_53e8;
  
  HighsLpRelaxation::HighsLpRelaxation
            (&local_53e8,
             &((this->mipsolver->mipdata_)._M_t.
               super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
               _M_t.
               super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
               .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->lp);
  local_5758._M_buckets = &local_5758._M_single_bucket;
  local_5758._M_bucket_count = 1;
  local_5758._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_5758._M_element_count = 0;
  local_5758._M_rehash_policy._M_max_load_factor = 1.0;
  local_5758._M_rehash_policy._M_next_resize = 0;
  local_5758._M_single_bucket = (__node_base_ptr)0x0;
  local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_57ec = HighsLpRelaxation::resolveLp(&local_53e8,(HighsDomain *)0x0);
  this->lp_iterations = this->lp_iterations + local_53e8.numlpiters;
  local_5720.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_5720.changedcolsflags_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_5770,(long)this->mipsolver->model_->num_col_,(value_type_conflict2 *)&local_5720
             ,(allocator_type *)&local_5788);
  local_5720.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_5788,(long)this->mipsolver->model_->num_col_,(value_type_conflict1 *)&local_5720
             ,(allocator_type *)&local_57d8);
  ppuVar1 = &local_5720.changedcolsflags_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_5720.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5720,"simplex_strategy","");
  Highs::setOptionValue(&local_53e8.lpsolver,(string *)&local_5720,4);
  if ((pointer *)
      local_5720.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_5720.changedcolsflags_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsLpRelaxation::setObjectiveLimit(&local_53e8,INFINITY);
  local_5720.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5720,"primal_simplex_bound_perturbation_multiplier","");
  Highs::setOptionValue(&local_53e8.lpsolver,(string *)&local_5720,0.0);
  if ((pointer *)
      local_5720.changedcolsflags_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(local_5720.changedcolsflags_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HighsLpRelaxation::setIterationLimit
            (&local_53e8,
             (int)(((this->mipsolver->mipdata_)._M_t.
                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                   avgrootlpiters * 5.0));
  this_00 = &this->randgen;
  do {
    if (local_53e8.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_53e8.fractionalints.
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) goto LAB_002d6294;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_57a8,&local_53e8.lpsolver.solution_.col_value);
    local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    _Var17._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    std::vector<int,_std::allocator<int>_>::reserve
              (&local_57d8,
               (long)*(pointer *)((long)&(_Var17._M_head_impl)->integer_cols + 8) -
               *(long *)&((_Var17._M_head_impl)->integer_cols).
                         super__Vector_base<int,_std::allocator<int>_> >> 2);
    HighsDomain::HighsDomain
              (&local_5720,
               &((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain);
    _Var17._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    piVar4 = *(pointer *)((long)&(_Var17._M_head_impl)->integer_cols + 8);
    for (piVar13 = *(int **)&((_Var17._M_head_impl)->integer_cols).
                             super__Vector_base<int,_std::allocator<int>_>;
        pdVar7 = local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start, piVar13 != piVar4; piVar13 = piVar13 + 1) {
      iVar19 = *piVar13;
      uVar12 = this_00->state >> 0xc ^ this_00->state;
      uVar12 = uVar12 << 0x19 ^ uVar12;
      uVar12 = uVar12 >> 0x1b ^ uVar12;
      dVar2 = local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19];
      this_00->state = uVar12;
      dVar2 = floor((double)(((uVar12 >> 0x20) + 0x8a183895eeac1536) *
                             ((uVar12 & 0xffffffff) + 0x42d8680e260ae5b) >> 0x20 ^
                            ((uVar12 >> 0x20) + 0x80c8963be3e4c2f3) *
                            ((uVar12 & 0xffffffff) + 0xc8497d2a400d9551) >> 0xb) *
                    1.1102230246251565e-16 * 0.19999999999999996 + 0.4 + dVar2);
      dVar22 = local_5720.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar19];
      if (local_5720.col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar19] <= dVar2) {
        dVar22 = dVar2;
      }
      dVar2 = local_5720.col_upper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19];
      uVar20 = SUB84(dVar2,0);
      uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
      if (dVar22 <= dVar2) {
        uVar20 = SUB84(dVar22,0);
        uVar21 = (undefined4)((ulong)dVar22 >> 0x20);
      }
      pdVar7[iVar19] = (double)CONCAT44(uVar21,uVar20);
      local_57b8 = (double)CONCAT44(uVar21,uVar20);
      local_57ac = (int)(double)CONCAT44(uVar21,uVar20);
      if (local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_57d8,
                   (iterator)
                   local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_57ac);
      }
      else {
        *local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_57ac;
        local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_5720.infeasible_ == false) {
        HighsDomain::fixCol(&local_5720,iVar19,local_57b8,(Reason)0xffffffff);
        if (local_5720.infeasible_ == false) {
          HighsDomain::propagate(&local_5720);
          if (local_5720.infeasible_ != true) goto LAB_002d5f1d;
        }
        HighsDomain::conflictAnalysis
                  (&local_5720,
                   &((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->conflictPool
                  );
      }
LAB_002d5f1d:
    }
    pVar23 = std::
             _Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
             ::_M_emplace<std::vector<int,std::allocator<int>>&>
                       ((_Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)&local_5758,&local_57d8);
    if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar11 = 0;
      do {
        local_57b8 = (double)CONCAT44(local_57b8._4_4_,(int)uVar11);
        _Var17._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        lVar18 = *(long *)&((_Var17._M_head_impl)->integer_cols).
                           super__Vector_base<int,_std::allocator<int>_>;
        iVar19 = 10;
        do {
          uVar10 = (uint32_t)
                   ((ulong)((long)*(pointer *)
                                   ((long)&((_Var17._M_head_impl)->integer_cols).
                                           super__Vector_base<int,_std::allocator<int>_> + 8) -
                           lVar18) >> 2);
          if ((int)uVar10 < 2) {
            lVar15 = 0;
          }
          else {
            uVar5 = 0x1f;
            if (uVar10 - 1 != 0) {
              for (; uVar10 - 1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            uVar10 = HighsRandom::drawUniform(this_00,uVar10,(uVar5 ^ 0xffffffe0) + 0x21);
            _Var17._M_head_impl =
                 (this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            lVar18 = *(long *)&((_Var17._M_head_impl)->integer_cols).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data;
            lVar15 = (long)(int)uVar10;
          }
          pdVar7 = local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = (long)*(int *)(lVar18 + lVar15 * 4);
          dVar2 = local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16];
          dVar22 = local_53e8.lpsolver.solution_.col_value.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
          if (dVar2 <= dVar22) {
            if (dVar2 < dVar22) {
              dVar2 = ceil(dVar22);
              uVar20 = SUB84(dVar2,0);
              uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
              goto LAB_002d5fdf;
            }
            dVar22 = *(double *)
                      (*(long *)&((_Var17._M_head_impl)->domain).col_upper_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar16 * 8);
            if (dVar22 <= dVar2) {
              dVar22 = *(double *)
                        (*(long *)&((_Var17._M_head_impl)->domain).col_lower_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data + lVar16 * 8);
            }
          }
          else {
            dVar2 = floor(dVar22);
            uVar20 = SUB84(dVar2,0);
            uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_002d5fdf:
            dVar22 = (double)(int)(double)CONCAT44(uVar21,uVar20);
          }
          pdVar7[lVar16] = dVar22;
          local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar15] = (int)dVar22;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
        pVar23 = std::
                 _Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::_M_emplace<std::vector<int,std::allocator<int>>&>
                           ((_Hashtable<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>,std::__detail::_Identity,HighsVectorEqual,HighsVectorHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)&local_5758,&local_57d8);
        uVar11 = CONCAT71((uint7)(uint3)((ulong)local_57b8 >> 8),1);
      } while (((SUB81(local_57b8,0) | pVar23.second) & 1) == 0);
      iVar19 = 1;
      if (((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_002d6067;
    }
    else {
LAB_002d6067:
      bVar9 = linesearchRounding(this,&local_53e8.lpsolver.solution_.col_value,&local_57a8,2);
      iVar19 = 1;
      if (!bVar9) {
        _Var17._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        iVar19 = 3;
        if ((double)local_53e8.numlpiters < (_Var17._M_head_impl)->avgrootlpiters * 5.0 + 1000.0) {
          piVar13 = *(int **)&((_Var17._M_head_impl)->integer_cols).
                              super__Vector_base<int,_std::allocator<int>_>;
          piVar4 = *(pointer *)((long)&(_Var17._M_head_impl)->integer_cols + 8);
          if (piVar13 != piVar4) {
            lVar18 = *(long *)&((_Var17._M_head_impl)->uplocks).
                               super__Vector_base<int,_std::allocator<int>_>;
            uVar14 = this_00->state;
            do {
              lVar15 = (long)*piVar13;
              if ((*(int *)(lVar18 + lVar15 * 4) == 0) ||
                 (*(int *)(*(long *)&((_Var17._M_head_impl)->downlocks).
                                     super__Vector_base<int,_std::allocator<int>_> + lVar15 * 4) ==
                  0)) {
                local_5788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] = 0.0;
              }
              else {
                dVar2 = local_53e8.lpsolver.solution_.col_value.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar15];
                dVar22 = local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar15];
                dVar3 = (_Var17._M_head_impl)->feastol;
                uVar12 = uVar14 >> 0xc ^ uVar14;
                uVar12 = uVar12 << 0x19 ^ uVar12;
                uVar14 = uVar12 >> 0x1b ^ uVar12;
                this_00->state = uVar14;
                dVar6 = (double)(((uVar14 >> 0x20) + 0x8a183895eeac1536) *
                                 ((uVar14 & 0xffffffff) + 0x42d8680e260ae5b) >> 0x20 ^
                                ((uVar14 >> 0x20) + 0x80c8963be3e4c2f3) *
                                ((uVar14 & 0xffffffff) + 0xc8497d2a400d9551) >> 0xb) *
                        1.1102230246251565e-16 * 0.0002 + -0.0001;
                if (dVar2 <= dVar22 - dVar3) {
                  dVar6 = dVar6 + 1.0;
                }
                else {
                  dVar6 = dVar6 + -1.0;
                }
                local_5788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] = dVar6;
              }
              piVar13 = piVar13 + 1;
            } while (piVar13 != piVar4);
          }
          Highs::changeColsCost
                    (&local_53e8.lpsolver,
                     local_5770.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_5788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          iVar8 = local_53e8.numlpiters;
          local_57ec = HighsLpRelaxation::resolveLp(&local_53e8,(HighsDomain *)0x0);
          if (local_53e8.numlpiters - iVar8 != 0) {
            this->lp_iterations = this->lp_iterations + (local_53e8.numlpiters - iVar8);
            iVar19 = 0;
          }
        }
      }
    }
    HighsDomain::~HighsDomain(&local_5720);
    if (local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_57d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while (iVar19 == 0);
  if ((iVar19 == 3) &&
     (local_53e8.fractionalints.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_53e8.fractionalints.
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
LAB_002d6294:
    if ((local_57ec == kUnscaledPrimalFeasible) || (local_57ec == kOptimal)) {
      HighsMipSolverData::addIncumbent
                ((this->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
                 &local_53e8.lpsolver.solution_.col_value,local_53e8.objective,2,true,false);
    }
  }
  if (local_5788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (double *)0x0) {
    operator_delete(local_5788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5770.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (HighsInt *)0x0) {
    operator_delete(local_5770.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_57a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>,_std::__detail::_Identity,_HighsVectorEqual,_HighsVectorHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_5758);
  HighsLpRelaxation::~HighsLpRelaxation(&local_53e8);
  return;
}

Assistant:

void HighsPrimalHeuristics::feasibilityPump() {
  HighsLpRelaxation lprelax(mipsolver.mipdata_->lp);
  std::unordered_set<std::vector<HighsInt>, HighsVectorHasher, HighsVectorEqual>
      referencepoints;
  std::vector<double> roundedsol;
  HighsLpRelaxation::Status status = lprelax.resolveLp();
  lp_iterations += lprelax.getNumLpIterations();

  std::vector<double> fracintcost;
  std::vector<HighsInt> fracintset;

  std::vector<HighsInt> mask(mipsolver.model_->num_col_, 1);
  std::vector<double> cost(mipsolver.model_->num_col_, 0.0);

  lprelax.getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
  lprelax.setObjectiveLimit();
  lprelax.getLpSolver().setOptionValue(
      "primal_simplex_bound_perturbation_multiplier", 0.0);

  lprelax.setIterationLimit(5 * mipsolver.mipdata_->avgrootlpiters);

  while (!lprelax.getFractionalIntegers().empty()) {
    const auto& lpsol = lprelax.getLpSolver().getSolution().col_value;
    roundedsol = lprelax.getLpSolver().getSolution().col_value;

    std::vector<HighsInt> referencepoint;
    referencepoint.reserve(mipsolver.mipdata_->integer_cols.size());

    auto localdom = mipsolver.mipdata_->domain;
    for (HighsInt i : mipsolver.mipdata_->integer_cols) {
      assert(mipsolver.variableType(i) == HighsVarType::kInteger);
      double intval = std::floor(roundedsol[i] + randgen.real(0.4, 0.6));
      intval = std::max(intval, localdom.col_lower_[i]);
      intval = std::min(intval, localdom.col_upper_[i]);
      roundedsol[i] = intval;
      referencepoint.push_back((HighsInt)intval);
      if (!localdom.infeasible()) {
        localdom.fixCol(i, intval, HighsDomain::Reason::branching());
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          continue;
        }
        localdom.propagate();
        if (localdom.infeasible()) {
          localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
          continue;
        }
      }
    }

    bool havecycle = !referencepoints.emplace(referencepoint).second;
    for (HighsInt k = 0; havecycle && k < 2; ++k) {
      for (HighsInt i = 0; i != 10; ++i) {
        HighsInt flippos =
            randgen.integer(mipsolver.mipdata_->integer_cols.size());
        HighsInt col = mipsolver.mipdata_->integer_cols[flippos];
        if (roundedsol[col] > lpsol[col])
          roundedsol[col] = (HighsInt)std::floor(lpsol[col]);
        else if (roundedsol[col] < lpsol[col])
          roundedsol[col] = (HighsInt)std::ceil(lpsol[col]);
        else if (roundedsol[col] < mipsolver.mipdata_->domain.col_upper_[col])
          roundedsol[col] = mipsolver.mipdata_->domain.col_upper_[col];
        else
          roundedsol[col] = mipsolver.mipdata_->domain.col_lower_[col];

        referencepoint[flippos] = (HighsInt)roundedsol[col];
      }
      havecycle = !referencepoints.emplace(referencepoint).second;
    }

    if (havecycle) return;

    if (linesearchRounding(lpsol, roundedsol, kSolutionSourceFeasibilityPump))
      return;

    if (lprelax.getNumLpIterations() >=
        1000 + mipsolver.mipdata_->avgrootlpiters * 5)
      break;

    for (HighsInt i : mipsolver.mipdata_->integer_cols) {
      assert(mipsolver.variableType(i) == HighsVarType::kInteger);

      if (mipsolver.mipdata_->uplocks[i] == 0 ||
          mipsolver.mipdata_->downlocks[i] == 0)
        cost[i] = 0.0;
      else if (lpsol[i] > roundedsol[i] - mipsolver.mipdata_->feastol)
        cost[i] = -1.0 + randgen.real(-1e-4, 1e-4);
      else
        cost[i] = 1.0 + randgen.real(-1e-4, 1e-4);
    }

    lprelax.getLpSolver().changeColsCost(mask.data(), cost.data());
    int64_t niters = -lprelax.getNumLpIterations();
    status = lprelax.resolveLp();
    niters += lprelax.getNumLpIterations();
    if (niters == 0) break;
    lp_iterations += niters;
  }

  if (lprelax.getFractionalIntegers().empty() &&
      lprelax.unscaledPrimalFeasible(status))
    mipsolver.mipdata_->addIncumbent(
        lprelax.getLpSolver().getSolution().col_value, lprelax.getObjective(),
        kSolutionSourceFeasibilityPump);
}